

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O3

Flow * __thiscall
wasm::ModuleRunnerBase<wasm::ModuleRunner>::visitAtomicWait
          (Flow *__return_storage_ptr__,ModuleRunnerBase<wasm::ModuleRunner> *this,AtomicWait *curr)

{
  Name memoryName;
  Name memory;
  char *this_00;
  char cVar1;
  Index bytes;
  Address memorySize;
  Address addr;
  anon_union_16_5_9943fe1e_for_Literal_0 *value;
  anon_union_16_5_9943fe1e_for_Literal_0 local_188;
  undefined8 local_178;
  anon_union_16_5_9943fe1e_for_Literal_0 local_170;
  undefined8 local_160;
  undefined1 local_158 [8];
  Flow timeout;
  undefined1 local_f8 [8];
  Literal loaded;
  Flow ptr;
  Flow expected;
  MemoryInstanceInfo info;
  
  ExpressionRunner<wasm::ModuleRunner>::visit
            ((Flow *)&loaded.type,&this->super_ExpressionRunner<wasm::ModuleRunner>,
             *(Expression **)(curr + 0x18));
  if (ptr.breakTo.super_IString.str._M_len == 0) {
    ExpressionRunner<wasm::ModuleRunner>::visit
              ((Flow *)&ptr.breakTo.super_IString.str._M_str,
               &this->super_ExpressionRunner<wasm::ModuleRunner>,*(Expression **)(curr + 0x20));
    if (expected.breakTo.super_IString.str._M_len == 0) {
      ExpressionRunner<wasm::ModuleRunner>::visit
                ((Flow *)local_158,&this->super_ExpressionRunner<wasm::ModuleRunner>,
                 *(Expression **)(curr + 0x28));
      if (timeout.breakTo.super_IString.str._M_len == 0) {
        bytes = wasm::Type::getByteSize();
        getMemoryInstanceInfo
                  ((MemoryInstanceInfo *)&expected.breakTo.super_IString.str._M_str,this,
                   (Name)*(string_view *)(curr + 0x38));
        memory.super_IString.str._M_str = (char *)info.name.super_IString.str._M_len;
        memory.super_IString.str._M_len = (size_t)info.instance;
        memorySize = getMemorySize((ModuleRunnerBase<wasm::ModuleRunner> *)
                                   expected.breakTo.super_IString.str._M_str,memory);
        this_00 = expected.breakTo.super_IString.str._M_str;
        if (((long)((long)ptr.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                          super__Vector_impl_data._M_start -
                   ptr.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id) >> 3)
            * -0x5555555555555555 + loaded.type.id != 1) {
LAB_00127750:
          __assert_fail("values.size() == 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-interpreter.h"
                        ,0x43,"const Literal &wasm::Flow::getSingleValue()");
        }
        wasm::Literal::Literal((Literal *)&timeout.breakTo.super_IString.str._M_str,(Literal *)&ptr)
        ;
        addr = getFinalAddress<wasm::AtomicWait>
                         ((ModuleRunnerBase<wasm::ModuleRunner> *)this_00,curr,
                          (Literal *)&timeout.breakTo.super_IString.str._M_str,bytes,memorySize);
        wasm::Literal::~Literal((Literal *)&timeout.breakTo.super_IString.str._M_str);
        memoryName.super_IString.str._M_str = (char *)info.name.super_IString.str._M_len;
        memoryName.super_IString.str._M_len = (size_t)info.instance;
        doAtomicLoad((Literal *)local_f8,
                     (ModuleRunnerBase<wasm::ModuleRunner> *)
                     expected.breakTo.super_IString.str._M_str,addr,bytes,
                     (Type)*(uintptr_t *)(curr + 0x30),memoryName,memorySize);
        if (ptr.breakTo.super_IString.str._M_str +
            ((long)((long)expected.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                          super__Vector_impl_data._M_start -
                   expected.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id)
            >> 3) * -0x5555555555555555 != (char *)0x1) goto LAB_00127750;
        cVar1 = wasm::Literal::operator!=((Literal *)local_f8,(Literal *)&expected);
        if (cVar1 == '\0') {
          value = &local_170;
          local_170.i32 = 0;
          local_160 = 2;
          Flow::Flow(__return_storage_ptr__,(Literal *)&value->func);
        }
        else {
          value = &local_188;
          local_188.i32 = 1;
          local_178 = 2;
          Flow::Flow(__return_storage_ptr__,(Literal *)&value->func);
        }
        wasm::Literal::~Literal((Literal *)&value->func);
        wasm::Literal::~Literal((Literal *)local_f8);
      }
      else {
        (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed =
             (size_t)local_158;
        wasm::Literal::Literal
                  ((__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed.
                   _M_elems,(Literal *)&timeout);
        (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
        super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)timeout.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id
        ;
        (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
        super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
        super__Vector_impl_data._M_finish =
             timeout.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
             super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
             super__Vector_impl_data._M_start;
        (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
        super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             timeout.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
             super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
             super__Vector_impl_data._M_finish;
        timeout.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id = 0;
        timeout.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
        super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        timeout.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
        super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        (__return_storage_ptr__->breakTo).super_IString.str._M_len =
             (size_t)timeout.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                     super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
        (__return_storage_ptr__->breakTo).super_IString.str._M_str =
             (char *)timeout.breakTo.super_IString.str._M_len;
      }
      std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
                ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)
                 &timeout.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type);
      wasm::Literal::~Literal((Literal *)&timeout);
    }
    else {
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed =
           (size_t)ptr.breakTo.super_IString.str._M_str;
      wasm::Literal::Literal
                ((__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed.
                 _M_elems,(Literal *)&expected);
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)expected.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id;
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_finish =
           expected.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
           super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
           super__Vector_impl_data._M_start;
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           expected.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
           super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
           super__Vector_impl_data._M_finish;
      expected.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id = 0;
      expected.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      expected.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->breakTo).super_IString.str._M_len =
           (size_t)expected.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                   super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
      (__return_storage_ptr__->breakTo).super_IString.str._M_str =
           (char *)expected.breakTo.super_IString.str._M_len;
    }
    std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
              ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)
               &expected.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type);
    wasm::Literal::~Literal((Literal *)&expected);
  }
  else {
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed =
         loaded.type.id;
    wasm::Literal::Literal
              ((__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems
               ,(Literal *)&ptr);
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)ptr.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_finish =
         ptr.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
         super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
         super__Vector_impl_data._M_start;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         ptr.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
         super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
         super__Vector_impl_data._M_finish;
    ptr.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id = 0;
    ptr.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    ptr.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->breakTo).super_IString.str._M_len =
         (size_t)ptr.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                 super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
    (__return_storage_ptr__->breakTo).super_IString.str._M_str =
         (char *)ptr.breakTo.super_IString.str._M_len;
  }
  std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
            ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)
             &ptr.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type);
  wasm::Literal::~Literal((Literal *)&ptr);
  return __return_storage_ptr__;
}

Assistant:

Flow visitAtomicWait(AtomicWait* curr) {
    NOTE_ENTER("AtomicWait");
    Flow ptr = self()->visit(curr->ptr);
    if (ptr.breaking()) {
      return ptr;
    }
    NOTE_EVAL1(ptr);
    auto expected = self()->visit(curr->expected);
    NOTE_EVAL1(expected);
    if (expected.breaking()) {
      return expected;
    }
    auto timeout = self()->visit(curr->timeout);
    NOTE_EVAL1(timeout);
    if (timeout.breaking()) {
      return timeout;
    }
    auto bytes = curr->expectedType.getByteSize();
    auto info = getMemoryInstanceInfo(curr->memory);
    auto memorySize = info.instance->getMemorySize(info.name);
    auto addr = info.instance->getFinalAddress(
      curr, ptr.getSingleValue(), bytes, memorySize);
    auto loaded = info.instance->doAtomicLoad(
      addr, bytes, curr->expectedType, info.name, memorySize);
    NOTE_EVAL1(loaded);
    if (loaded != expected.getSingleValue()) {
      return Literal(int32_t(1)); // not equal
    }
    // TODO: add threads support!
    //       for now, just assume we are woken up
    return Literal(int32_t(0)); // woken up
  }